

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Template_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::increase_size(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Template_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  sVar6 = this->mMask;
  if (sVar6 == 0) {
    init_data(this,8);
    return;
  }
  uVar5 = sVar6 + 1;
  if (uVar5 < 0x28f5c28f5c28f5d) {
    uVar4 = (uVar5 * 0x50) / 100;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5 >> 2;
    uVar4 = (SUB168(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar7 = this->mNumElements;
  if (uVar7 < uVar4) {
    bVar3 = try_increase_info(this);
    if (bVar3) {
      return;
    }
    uVar7 = this->mNumElements;
    sVar6 = this->mMask;
    uVar5 = sVar6 + 1;
  }
  if (uVar5 < 0x28f5c28f5c28f5d) {
    uVar5 = (uVar5 * 0x50) / 100;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5 >> 2;
    uVar5 = (SUB168(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  if (uVar7 * 2 < uVar5) {
    throwOverflowError(this);
    sVar6 = this->mMask;
  }
  rehashPowerOfTwo(this,sVar6 * 2 + 2);
  return;
}

Assistant:

void increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            init_data(InitialNumElements);
            return;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))
        // it seems we have a really bad hash function! don't try to resize again
        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            throwOverflowError();
        }

        rehashPowerOfTwo((mMask + 1) * 2);
    }